

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_7e301::ParseCommandActions::actOnDefaultDecl
          (ParseCommandActions *this,ArrayRef<llbuild::ninja::Token> names)

{
  Token *pTVar1;
  bool bVar2;
  ostream *poVar3;
  size_t in_RCX;
  iterator __begin2;
  Token *pTVar4;
  StringRef str;
  string local_50;
  
  pTVar4 = names.Data;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"actOnDefaultDecl",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(/*Names=*/[",0xc);
  if (names.Length != 0) {
    pTVar1 = pTVar4 + names.Length;
    bVar2 = true;
    do {
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"",1);
      str.Data = (char *)(ulong)pTVar4->length;
      str.Length = in_RCX;
      llbuild::commands::util::escapedString_abi_cxx11_(&local_50,(util *)pTVar4->start,str);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pTVar4 = pTVar4 + 1;
      bVar2 = false;
    } while (pTVar4 != pTVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"])\n",3);
  return;
}

Assistant:

virtual void actOnDefaultDecl(ArrayRef<ninja::Token> names) override {
    std::cerr << __FUNCTION__ << "(/*Names=*/[";
    bool first = true;
    for (auto& name: names) {
      if (!first)
        std::cerr << ", ";
      std::cerr << "\"" << escapedString(name) << "\"";
      first = false;
    }
    std::cerr << "])\n";
  }